

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O0

int __thiscall
beagle::cpu::BeagleCPUImpl<float,_1,_0>::setRootPrePartials
          (BeagleCPUImpl<float,_1,_0> *this,int *bufferIndices,int *stateFrequenciesIndices,
          int count)

{
  int iVar1;
  void *pvVar2;
  int in_ECX;
  int *in_RSI;
  float *in_RDI;
  int k;
  int i;
  int l;
  float *tmpRealPartialsOffset;
  float *inPartialsOffset;
  int bufferIndex;
  int stateFrequenciesIndex;
  undefined4 in_stack_ffffffffffffffb0;
  int in_stack_ffffffffffffffb4;
  int local_48;
  int local_44;
  undefined4 *local_40;
  int local_4;
  
  if (in_ECX == 1) {
    if ((*(byte *)((long)in_RDI + 0x136) & 1) == 0) {
      iVar1 = *in_RSI;
      if ((iVar1 < 0) || ((int)in_RDI[3] <= iVar1)) {
        local_4 = -5;
      }
      else {
        if (*(long *)(*(long *)(in_RDI + 0x2a) + (long)iVar1 * 8) == 0) {
          pvVar2 = malloc((long)(int)in_RDI[0xf] << 2);
          *(void **)(*(long *)(in_RDI + 0x2a) + (long)iVar1 * 8) = pvVar2;
          if (*(long *)(*(long *)(in_RDI + 0x2a) + (long)iVar1 * 8) == 0) {
            return -2;
          }
        }
        local_40 = *(undefined4 **)(*(long *)(in_RDI + 0x2a) + (long)iVar1 * 8);
        for (local_44 = 0; local_44 < (int)in_RDI[0xd]; local_44 = local_44 + 1) {
          for (local_48 = 0; local_48 < (int)in_RDI[5]; local_48 = local_48 + 1) {
            beagleMemCpy<float>((float *)CONCAT44(in_stack_ffffffffffffffb4,
                                                  in_stack_ffffffffffffffb0),in_RDI,0);
            local_40 = local_40 + (int)in_RDI[0xb];
          }
          for (in_stack_ffffffffffffffb4 = 0;
              in_stack_ffffffffffffffb4 < (int)in_RDI[0xb] * ((int)in_RDI[6] - (int)in_RDI[5]);
              in_stack_ffffffffffffffb4 = in_stack_ffffffffffffffb4 + 1) {
            *local_40 = 0;
            local_40 = local_40 + 1;
          }
        }
        local_4 = 0;
      }
    }
    else {
      local_4 = -7;
    }
  }
  else {
    local_4 = -7;
  }
  return local_4;
}

Assistant:

BEAGLE_CPU_TEMPLATE
int BeagleCPUImpl<BEAGLE_CPU_GENERIC>::setRootPrePartials(const int *bufferIndices,
                                                          const int *stateFrequenciesIndices,
                                                          int count) {
    if (count == 1) {
        // We treat this as a special case so that we don't have convoluted logic
        //      at the end of the loop over patterns
        if (kAutoRootPartitioningEnabled) {
//            calcRootLogLikelihoodsByAutoPartitionAsync(bufferIndices,
//                                                       categoryWeightsIndices,
//                                                       stateFrequenciesIndices,
//                                                       cumulativeScaleIndices,
//                                                       gAutoPartitionIndices,
//                                                       gAutoPartitionOutSumLogLikelihoods);
//
//            *outSumLogLikelihood = 0.0;
//
//            for (int i = 0; i < kPartitionCount; i++) {
//                *outSumLogLikelihood += gAutoPartitionOutSumLogLikelihoods[i];
//            }
//
//            if (*outSumLogLikelihood != *outSumLogLikelihood) {
//                return BEAGLE_ERROR_FLOATING_POINT;
//            } else {
//                return BEAGLE_SUCCESS;
//            }
            return BEAGLE_ERROR_NO_IMPLEMENTATION;
        } else {
            int stateFrequenciesIndex = stateFrequenciesIndices[0];
            int bufferIndex = bufferIndices[0];
            if (bufferIndex < 0 || bufferIndex >= kBufferCount)
                return BEAGLE_ERROR_OUT_OF_RANGE;
            if (gPartials[bufferIndex] == NULL) {
                gPartials[bufferIndex] = (REALTYPE *) malloc(sizeof(REALTYPE) * kPartialsSize);
                if (gPartials[bufferIndex] == 0L)
                    return BEAGLE_ERROR_OUT_OF_MEMORY;
            }
            const REALTYPE *inPartialsOffset = gStateFrequencies[stateFrequenciesIndex];
            REALTYPE *tmpRealPartialsOffset = gPartials[bufferIndex];
            for (int l = 0; l < kCategoryCount; l++) {
                for (int i = 0; i < kPatternCount; i++) {
                    beagleMemCpy(tmpRealPartialsOffset, inPartialsOffset, kStateCount);
                    tmpRealPartialsOffset += kPartialsPaddedStateCount;
                }
                // Pad extra buffer with zeros
                for (int k = 0; k < kPartialsPaddedStateCount * (kPaddedPatternCount - kPatternCount); k++) {
                    *tmpRealPartialsOffset++ = 0;
                }
            }

            return BEAGLE_SUCCESS;
        }
        return BEAGLE_ERROR_NO_IMPLEMENTATION;
    }
    return BEAGLE_ERROR_NO_IMPLEMENTATION;

}